

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

int __thiscall LinkedObjectFile::get_label_at(LinkedObjectFile *this,int seg,int offset)

{
  bool bVar1;
  pointer pvVar2;
  vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  *in_RDI;
  const_iterator kv;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_28;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_20 [3];
  int local_4;
  
  std::
  vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::at(in_RDI,(size_type)in_stack_ffffffffffffffc8);
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x1a9c59);
  std::
  vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::at(in_RDI,(size_type)in_stack_ffffffffffffffc8);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    pvVar2 = std::__detail::_Node_const_iterator<std::pair<const_int,_int>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_int,_int>,_false,_false> *)0x1a9caa);
    local_4 = pvVar2->second;
  }
  return local_4;
}

Assistant:

int LinkedObjectFile::get_label_at(int seg, int offset) const {
  auto kv = label_per_seg_by_offset.at(seg).find(offset);
  if (kv == label_per_seg_by_offset.at(seg).end()) {
    return -1;
  }

  return kv->second;
}